

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

string * __thiscall
helics::FederateState::processQuery_abi_cxx11_
          (FederateState *this,string_view query,bool force_ordering)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  bool bVar1;
  undefined1 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  FederateState *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  undefined1 in_stack_00000020 [16];
  string_view in_stack_00000030;
  string *qstring;
  FederateState *in_stack_00000a78;
  string_view in_stack_00000a80;
  char *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  size_t in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffe08;
  FederateStates in_stack_fffffffffffffe0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  undefined1 local_1d8 [48];
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_8a;
  byte local_89;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  string *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_89 = in_R8B & 1;
  local_8a = 0;
  pbVar3 = in_RDI;
  local_80 = in_RDX;
  uStack_78 = in_RCX;
  std::__cxx11::string::string(in_RDI);
  if ((local_89 & 1) == 0) {
    local_a0 = local_80;
    local_98 = uStack_78;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_fffffffffffffdc8)
    ;
    __x._M_str = in_stack_fffffffffffffdf0;
    __x._M_len = in_stack_fffffffffffffde8;
    __y._M_str = (char *)in_RSI;
    __y._M_len = (size_t)pbVar3;
    bVar1 = std::operator==(__x,__y);
    if (!bVar1) {
      local_c0 = local_80;
      local_b8 = uStack_78;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                 in_stack_fffffffffffffdc8);
      __x_00._M_str = in_stack_fffffffffffffdf0;
      __x_00._M_len = in_stack_fffffffffffffde8;
      __y_00._M_str = (char *)in_RSI;
      __y_00._M_len = (size_t)pbVar3;
      bVar1 = std::operator==(__x_00,__y_00);
      if (!bVar1) {
        local_e0 = local_80;
        local_d8 = uStack_78;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                   in_stack_fffffffffffffdc8);
        __x_01._M_str = in_stack_fffffffffffffdf0;
        __x_01._M_len = in_stack_fffffffffffffde8;
        __y_01._M_str = (char *)in_RSI;
        __y_01._M_len = (size_t)pbVar3;
        bVar1 = std::operator==(__x_01,__y_01);
        if (!bVar1) {
          local_100 = local_80;
          local_f8 = uStack_78;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                     in_stack_fffffffffffffdc8);
          __x_02._M_str = in_stack_fffffffffffffdf0;
          __x_02._M_len = in_stack_fffffffffffffde8;
          __y_02._M_str = (char *)in_RSI;
          __y_02._M_len = (size_t)pbVar3;
          bVar1 = std::operator==(__x_02,__y_02);
          if (!bVar1) goto LAB_005b3f41;
        }
      }
    }
    local_148 = local_80;
    uStack_140 = uStack_78;
    processQueryActual_abi_cxx11_(in_stack_00000a78,in_stack_00000a80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
  }
  else {
LAB_005b3f41:
    local_168 = local_80;
    local_160 = uStack_78;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_fffffffffffffdc8)
    ;
    __x_03._M_str = in_stack_fffffffffffffdf0;
    __x_03._M_len = in_stack_fffffffffffffde8;
    __y_03._M_str = (char *)in_RSI;
    __y_03._M_len = (size_t)pbVar3;
    bVar1 = std::operator==(__x_03,__y_03);
    if (!bVar1) {
      local_188 = local_80;
      local_180 = uStack_78;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                 in_stack_fffffffffffffdc8);
      __x_04._M_str = in_stack_fffffffffffffdf0;
      __x_04._M_len = in_stack_fffffffffffffde8;
      __y_04._M_str = (char *)in_RSI;
      __y_04._M_len = (size_t)pbVar3;
      bVar1 = std::operator==(__x_04,__y_04);
      if (!bVar1) {
        local_1a8 = local_80;
        local_1a0 = uStack_78;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
                   in_stack_fffffffffffffdc8);
        __x_05._M_str = in_stack_fffffffffffffdf0;
        __x_05._M_len = in_stack_fffffffffffffde8;
        __y_05._M_str = (char *)in_RSI;
        __y_05._M_len = (size_t)pbVar3;
        bVar1 = std::operator==(__x_05,__y_05);
        if (bVar1) {
          getState((FederateState *)0x5b4096);
          local_30 = fedStateString_abi_cxx11_(in_stack_fffffffffffffe0f);
          local_18 = local_1d8;
          local_28 = "\"{}\"";
          uStack_20 = 4;
          local_48 = "\"{}\"";
          uStack_40 = 4;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_RDI,local_30);
          local_8 = &local_58;
          local_10 = local_68;
          local_58 = 0xd;
          local_50 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_00000030,(format_args)in_stack_00000020);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffffe10,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0));
          return pbVar3;
        }
        uVar2 = try_lock(in_RSI);
        if (!(bool)uVar2) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8);
          return pbVar3;
        }
        processQueryActual_abi_cxx11_(in_stack_00000a78,in_stack_00000a80);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffe10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_fffffffffffffdc0));
        unlock((FederateState *)CONCAT17(uVar2,in_stack_fffffffffffffdc0));
        return pbVar3;
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),
               in_stack_fffffffffffffdb8);
  }
  return pbVar3;
}

Assistant:

std::string FederateState::processQuery(std::string_view query, bool force_ordering) const
{
    std::string qstring;
    if (!force_ordering &&
        (query == "publications" || query == "inputs" || query == "endpoints" ||
         query == "global_state")) {  // these never need to be locked
        qstring = processQueryActual(query);
    } else if ((query == "queries") || (query == "available_queries")) {
        qstring =
            R"("publications","inputs","logs","endpoints","subscriptions","current_state","global_state","dependencies","timeconfig","config","dependents","current_time","global_time","global_status","unconnected_interfaces")";
    } else if (query == "state") {
        qstring = fmt::format("\"{}\"", fedStateString(getState()));
    } else {  // the rest might need be locked to prevent a race condition
        if (try_lock()) {
            qstring = processQueryActual(query);
            unlock();
        } else {
            qstring = "#wait";
        }
    }
    return qstring;
}